

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  pointer pcVar1;
  GeneratorFactory *pGVar2;
  pointer puVar3;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var4;
  pointer puVar5;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Context *this_00;
  ClassNameResolver *pCVar10;
  ImmutableGeneratorFactory *this_01;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var11;
  FileDescriptor *pFVar12;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var13;
  undefined7 in_register_00000009;
  long lVar14;
  long lVar15;
  string local_50;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this->file_ = file;
  FileJavaPackage_abi_cxx11_
            (&this->java_package_,(java *)file,
             (FileDescriptor *)(CONCAT71(in_register_00000009,immutable_api) & 0xffffffff),
             immutable_api);
  (this->classname_)._M_dataplus._M_p = (pointer)&(this->classname_).field_2;
  (this->classname_)._M_string_length = 0;
  (this->classname_).field_2._M_local_buf[0] = '\0';
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
  ::vector(&this->message_generators_,(long)*(int *)(file + 0x2c),(allocator_type *)&local_50);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
  ::vector(&this->extension_generators_,(long)*(int *)(file + 0x3c),(allocator_type *)&local_50);
  (this->generator_factory_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>._M_head_impl =
       (GeneratorFactory *)0x0;
  this_00 = (Context *)operator_new(0xb0);
  Context::Context(this_00,file,options);
  (this->context_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>._M_head_impl = this_00;
  pCVar10 = Context::GetNameResolver(this_00);
  this->name_resolver_ = pCVar10;
  bVar7 = options->generate_mutable_code;
  bVar8 = options->generate_shared_code;
  bVar9 = options->enforce_lite;
  (this->options_).generate_immutable_code = options->generate_immutable_code;
  (this->options_).generate_mutable_code = bVar7;
  (this->options_).generate_shared_code = bVar8;
  (this->options_).enforce_lite = bVar9;
  (this->options_).annotate_code = options->annotate_code;
  (this->options_).annotation_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_list_file.field_2;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_list_file,pcVar1,
             pcVar1 + (options->annotation_list_file)._M_string_length);
  (this->options_).output_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).output_list_file.field_2;
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_list_file,pcVar1,
             pcVar1 + (options->output_list_file)._M_string_length);
  this->immutable_api_ = immutable_api;
  ClassNameResolver::GetFileClassName_abi_cxx11_(&local_50,this->name_resolver_,file,immutable_api);
  std::__cxx11::string::operator=((string *)&this->classname_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_01 = (ImmutableGeneratorFactory *)operator_new(0x10);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory
            (this_01,(this->context_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::java::Context_*,_std::default_delete<google::protobuf::compiler::java::Context>_>
                     .super__Head_base<0UL,_google::protobuf::compiler::java::Context_*,_false>.
                     _M_head_impl);
  pGVar2 = (this->generator_factory_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
           .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
           _M_head_impl;
  (this->generator_factory_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>._M_head_impl =
       (GeneratorFactory *)this_01;
  if (pGVar2 != (GeneratorFactory *)0x0) {
    (*pGVar2->_vptr_GeneratorFactory[1])();
  }
  pFVar12 = this->file_;
  if (0 < *(int *)(pFVar12 + 0x2c)) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      puVar3 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pGVar2 = (this->generator_factory_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
               _M_head_impl;
      _Var11._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl._0_4_ =
           (*pGVar2->_vptr_GeneratorFactory[2])(pGVar2,*(long *)(pFVar12 + 0x58) + lVar14);
      _Var11._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl._4_4_ = extraout_var;
      _Var4._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = puVar3[lVar15]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      puVar3[lVar15]._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      ._M_t = _Var11._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
              .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
              _M_head_impl;
      if ((_Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           )_Var4._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
            _M_head_impl != (MessageGenerator *)0x0) {
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                              ._M_head_impl + 8))();
      }
      lVar15 = lVar15 + 1;
      pFVar12 = this->file_;
      lVar14 = lVar14 + 0x88;
    } while (lVar15 < *(int *)(pFVar12 + 0x2c));
  }
  pFVar12 = this->file_;
  if (0 < *(int *)(pFVar12 + 0x3c)) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      puVar5 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pGVar2 = (this->generator_factory_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
               _M_head_impl;
      _Var13._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl._0_4_ =
           (*pGVar2->_vptr_GeneratorFactory[3])(pGVar2,*(long *)(pFVar12 + 0x70) + lVar14);
      _Var13._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl._4_4_ = extraout_var_00;
      _Var6._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = puVar5[lVar15]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                     ._M_t;
      puVar5[lVar15]._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      ._M_t = _Var13._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
              .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
              _M_head_impl;
      if ((_Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
           )_Var6._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
            _M_head_impl != (ExtensionGenerator *)0x0) {
        (**(code **)(*(long *)_Var6._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                              ._M_head_impl + 8))();
      }
      lVar15 = lVar15 + 1;
      pFVar12 = this->file_;
      lVar14 = lVar14 + 0x48;
    } while (lVar15 < *(int *)(pFVar12 + 0x3c));
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(file->message_type_count()),
      extension_generators_(file->extension_count()),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}